

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffcfmt(char *tform,char *cform)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ushort uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  
  *cform = '\0';
  for (uVar8 = 0; bVar1 = tform[uVar8], bVar1 == 0x20; uVar8 = uVar8 + 1) {
  }
  if ((bVar1 - 0x41 < 9) && ((0x139U >> (bVar1 - 0x41 & 0x1f) & 1) != 0)) {
    bVar3 = false;
  }
  else {
    if (bVar1 == 0) {
      return;
    }
    bVar3 = true;
  }
  if (!bVar3) {
    pcVar7 = tform + (uVar8 & 0xffffffff);
    bVar3 = false;
    do {
      pcVar7 = pcVar7 + 1;
      cVar2 = *pcVar7;
      if (cVar2 == '.') {
        uVar4 = (ushort)!bVar3;
        bVar3 = true;
      }
      else {
        if (cVar2 == '\0') {
          *cform = '%';
          strcpy(cform + 1,tform + (uVar8 + 1 & 0xffffffff));
          if (tform[uVar8] == 'I') {
            sVar6 = strlen(cform);
            builtin_strncpy(cform + sVar6,".0f",4);
          }
          else if (tform[uVar8] == 'A') {
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 's';
            (cform + sVar6)[1] = '\0';
          }
          if (tform[uVar8] == 'F') {
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 'f';
            (cform + sVar6)[1] = '\0';
          }
          if (tform[uVar8] == 'E') {
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 'E';
            (cform + sVar6)[1] = '\0';
          }
          if (tform[uVar8] != 'D') {
            return;
          }
          sVar6 = strlen(cform);
          (cform + sVar6)[0] = 'E';
          (cform + sVar6)[1] = '\0';
          return;
        }
        ppuVar5 = __ctype_b_loc();
        uVar4 = (*ppuVar5)[cVar2] >> 0xb & 1;
      }
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void ffcfmt(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS format string for an ASCII Table extension column into the
  equivalent C format string that can be used in a printf statement, after
  the values have been read as a double.
*/
{
    int ii, istart, isgood, npt;
    
    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
        return;    /* input format string was blank */
    istart = ii;
    
    isgood = 1;
    npt = 0;
    if (tform[ii] != 'A' && tform[ii] != 'I' && tform[ii] != 'F'
                 && tform[ii] != 'E' && tform[ii] != 'D')
       isgood = 0;
    ii++;
    while (isgood && tform[ii] != 0)
    {
       /* one period is allowed */
       if (tform[ii] == '.')
       {
          if (npt > 0)
            isgood = 0;
          else
            ++npt; 
       }
       else if (!isdigit(tform[ii]))
          isgood = 0;
       ++ii; 
    }
    if (!isgood)
       return;

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[istart + 1]); /* append the width and decimal code */


    if (tform[istart] == 'A')
        strcat(cform, "s");
    else if (tform[istart] == 'I')
        strcat(cform, ".0f");  /*  0 precision to suppress decimal point */
    if (tform[istart] == 'F')
        strcat(cform, "f");
    if (tform[istart] == 'E')
        strcat(cform, "E");
    if (tform[istart] == 'D')
        strcat(cform, "E");

    return;
}